

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O3

void __thiscall
Assimp::MMDImporter::InternReadFile
          (MMDImporter *this,string *file,aiScene *pScene,IOSystem *param_3)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  runtime_error *prVar4;
  long *plVar5;
  PmxModel model;
  istream fileStream;
  filebuf fb;
  undefined1 local_360 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  int local_2d0;
  __uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_> local_2c8;
  int local_2c0;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_2b8;
  int local_2b0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  local_2a8;
  int local_2a0;
  __uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_> local_298;
  int local_290;
  __uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_> local_288;
  int local_280;
  __uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_> local_278;
  int local_270;
  __uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_> local_268;
  int local_260;
  __uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_> local_258;
  int local_250;
  __uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_> local_248;
  int local_240;
  __uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_> local_238;
  undefined1 local_230 [280];
  streambuf local_118 [240];
  
  std::filebuf::filebuf(local_118);
  lVar1 = std::filebuf::open((char *)local_118,(_Ios_Openmode)(file->_M_dataplus)._M_p);
  if (lVar1 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "Failed to open file ",file);
    plVar3 = (long *)std::__cxx11::string::append(local_230);
    local_360._0_8_ = *plVar3;
    plVar5 = plVar3 + 2;
    if ((long *)local_360._0_8_ == plVar5) {
      local_360._16_8_ = *plVar5;
      local_360._24_8_ = plVar3[3];
      local_360._0_8_ = local_360 + 0x10;
    }
    else {
      local_360._16_8_ = *plVar5;
    }
    local_360._8_4_ = (undefined4)plVar3[1];
    local_360._12_4_ = (undefined4)((ulong)plVar3[1] >> 0x20);
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error(prVar4,(string *)local_360);
    *(undefined ***)prVar4 = &PTR__runtime_error_007da4b8;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::istream(local_230,local_118);
  std::istream::seekg((long)local_230,_S_beg);
  uVar2 = std::istream::tellg();
  std::istream::seekg((long)local_230,_S_beg);
  if (0x12f < uVar2) {
    local_360._16_8_ = &local_340;
    local_360._0_4_ = 0.0;
    local_360[4] = '\0';
    local_360[5] = '\0';
    local_360[6] = '\0';
    local_360[7] = '\0';
    local_360[8] = '\0';
    local_360[9] = '\0';
    local_360[10] = '\0';
    local_360[0xb] = '\0';
    local_360._24_8_ = 0;
    local_340._M_local_buf[0] = '\0';
    local_330._M_p = (pointer)&local_320;
    local_328 = 0;
    local_320._M_local_buf[0] = '\0';
    local_310._M_p = (pointer)&local_300;
    local_308 = 0;
    local_300._M_local_buf[0] = '\0';
    local_2f0._M_p = (pointer)&local_2e0;
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_2d0 = 0;
    local_2c8._M_t.super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
    super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl =
         (tuple<pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>)0x0;
    local_2c0 = 0;
    local_2b8._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)
         (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
    local_2b0 = 0;
    local_2a8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
            )0x0;
    local_2a0 = 0;
    local_298._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
    super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl =
         (tuple<pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>)0x0;
    local_290 = 0;
    local_288._M_t.super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl =
         (tuple<pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>)0x0;
    local_280 = 0;
    local_278._M_t.super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
    super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl =
         (tuple<pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>)0x0;
    local_270 = 0;
    local_268._M_t.super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
    super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl =
         (tuple<pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>)0x0;
    local_260 = 0;
    local_258._M_t.
    super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
    super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl =
         (tuple<pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>)0x0;
    local_250 = 0;
    local_248._M_t.super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
    super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl =
         (tuple<pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>)0x0;
    local_240 = 0;
    local_238._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl =
         (tuple<pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>)
         (_Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>)0x0;
    pmx::PmxModel::Read((PmxModel *)local_360,(istream *)local_230);
    CreateDataFromImport(this,(PmxModel *)local_360,pScene);
    pmx::PmxModel::~PmxModel((PmxModel *)local_360);
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _atan2;
    local_230._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)(local_230 + 0x10));
    std::filebuf::~filebuf(local_118);
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,file
                 ," is too small.");
  std::runtime_error::runtime_error(prVar4,(string *)local_360);
  *(undefined ***)prVar4 = &PTR__runtime_error_007da4b8;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MMDImporter::InternReadFile(const std::string &file, aiScene *pScene,
                                 IOSystem * /*pIOHandler*/) {
  // Read file by istream
  std::filebuf fb;
  if (!fb.open(file, std::ios::in | std::ios::binary)) {
    throw DeadlyImportError("Failed to open file " + file + ".");
  }

  std::istream fileStream(&fb);

  // Get the file-size and validate it, throwing an exception when fails
  fileStream.seekg(0, fileStream.end);
  size_t fileSize = static_cast<size_t>(fileStream.tellg());
  fileStream.seekg(0, fileStream.beg);

  if (fileSize < sizeof(pmx::PmxModel)) {
    throw DeadlyImportError(file + " is too small.");
  }

  pmx::PmxModel model;
  model.Read(&fileStream);

  CreateDataFromImport(&model, pScene);
}